

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall BasicBlock::CheckLegalityAndFoldPathDepBranches(BasicBlock *this,GlobOpt *globOpt)

{
  Func **ppFVar1;
  IRKind IVar2;
  OpCode OVar3;
  Type TVar4;
  uint uVar5;
  uint uVar6;
  LabelInstr *pLVar7;
  Type pJVar8;
  Opnd *pOVar9;
  Instr *pIVar10;
  Func *func;
  code *pcVar11;
  bool bVar12;
  OpndKind OVar13;
  BOOLEAN BVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint32 offset;
  undefined4 *puVar18;
  LabelInstr *pLVar19;
  ValueHashTable<Sym_*,_Value_*> *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  StackSym *pSVar20;
  Value *pVVar21;
  Value **ppVVar22;
  BVSparse<Memory::JitArenaAllocator> *pBVar23;
  JITTimeFunctionBody *pJVar24;
  FunctionJITTimeInfo *pFVar25;
  BasicBlock *pBVar26;
  char16 *pcVar27;
  LabelInstr *pLVar28;
  ByteCodeUsesInstr *instr;
  BranchInstr *pBVar29;
  Instr *instr_00;
  Type *ppFVar30;
  Func **ppFVar31;
  Instr *lastInstr;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  LabelInstr *pLVar35;
  LabelInstr *this_02;
  undefined1 local_a8 [8];
  EditingIterator iter;
  LabelInstr *local_60;
  LabelInstr *local_48;
  LabelInstr *local_38;
  
  pBVar26 = this->next;
  ppFVar1 = &this->func;
  ppFVar31 = (Func **)&pBVar26->firstInstr;
  if (pBVar26 == (BasicBlock *)0x0) {
    ppFVar31 = ppFVar1;
  }
  lVar33 = 0x18;
  if (pBVar26 == (BasicBlock *)0x0) {
    lVar33 = 0xd0;
  }
  lVar33 = *(long *)((long)&(*ppFVar31)->m_alloc + lVar33);
  if (lVar33 == 0) {
    pLVar28 = (LabelInstr *)0x0;
  }
  else {
    pLVar28 = *(LabelInstr **)(lVar33 + 0x10);
  }
  pLVar35 = (LabelInstr *)this->firstInstr;
  if (pLVar35 == pLVar28) {
    local_60 = (LabelInstr *)0x0;
    this_02 = (LabelInstr *)0x0;
  }
  else {
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    this_02 = (LabelInstr *)0x0;
    local_60 = (LabelInstr *)0x0;
    pLVar19 = (LabelInstr *)0x0;
    do {
      if ((pLVar19 != (LabelInstr *)0x0) && ((LabelInstr *)(pLVar19->super_Instr).m_next != pLVar35)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar18 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x1250,
                            "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                            "Modifying instr list but not using EDITING iterator!");
        if (!bVar12) goto LAB_0041cbdc;
        *puVar18 = 0;
      }
      bVar12 = OpCodeAttr::HasDeadFallThrough((pLVar35->super_Instr).m_opcode);
      if (bVar12) {
        return;
      }
      if ((pLVar35->super_Instr).m_opcode == InlineeEnd) {
        this_02 = pLVar35;
        local_60 = pLVar35;
      }
      pLVar7 = (LabelInstr *)(pLVar35->super_Instr).m_next;
      pLVar19 = pLVar35;
      pLVar35 = pLVar7;
    } while (pLVar7 != pLVar28);
    pBVar26 = this->next;
  }
  ppFVar31 = (Func **)&pBVar26->firstInstr;
  if (pBVar26 == (BasicBlock *)0x0) {
    ppFVar31 = ppFVar1;
  }
  lVar33 = 0x18;
  if (pBVar26 == (BasicBlock *)0x0) {
    lVar33 = 0xd0;
  }
  local_38 = *(LabelInstr **)((long)&(*ppFVar31)->m_alloc + lVar33);
  bVar12 = IsLegalForPathDepBranches(&local_38->super_Instr);
  if (bVar12) {
    this_00 = ValueHashTable<Sym_*,_Value_*>::New(globOpt->tempAlloc,8);
    this_01 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,globOpt->tempAlloc,0x3eba5c);
    pJVar8 = globOpt->tempAlloc;
    this_01->head = (Type_conflict)0x0;
    this_01->lastFoundIndex = (Type_conflict)0x0;
    this_01->alloc = pJVar8;
    this_01->lastUsedNodePrevNextField = (Type)this_01;
    if (local_38 != (LabelInstr *)0x0) {
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      iter.last = (NodeBase *)&this->succList;
      do {
        uVar15 = (uint)(local_38->super_Instr).m_kind;
        if (((5 < uVar15) || ((0x2cU >> (uVar15 & 0x1f) & 1) == 0)) &&
           (bVar12 = IsLegalOpcodeForPathDepBrFold(&local_38->super_Instr), !bVar12)) {
          return;
        }
        bVar12 = OpCodeAttr::HasDeadFallThrough((local_38->super_Instr).m_opcode);
        if (bVar12) {
          return;
        }
        IVar2 = (local_38->super_Instr).m_kind;
        if (((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) &&
           ((local_38->field_0x78 & 1) != 0)) {
          return;
        }
        if ((local_38->super_Instr).m_opcode == InlineeEnd) {
          bVar12 = this_02 != (LabelInstr *)0x0;
          this_02 = local_38;
          if (bVar12) {
            return;
          }
        }
        else {
          pOVar9 = (local_38->super_Instr).m_dst;
          if (pOVar9 != (Opnd *)0x0) {
            OVar13 = IR::Opnd::GetKind(pOVar9);
            if (OVar13 != OpndKindReg) {
              return;
            }
            pOVar9 = (local_38->super_Instr).m_dst;
            OVar13 = IR::Opnd::GetKind(pOVar9);
            if (OVar13 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar18 = 1;
              bVar12 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                  ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar12) {
LAB_0041cbdc:
                pcVar11 = (code *)invalidInstructionException();
                (*pcVar11)();
              }
              *puVar18 = 0;
            }
            pSVar20 = IR::Opnd::GetStackSym(pOVar9);
            BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pSVar20->super_Sym).m_id);
            OVar3 = (local_38->super_Instr).m_opcode;
            if (((OVar3 - 0x1e4 < 2) || (OVar3 == LdFld)) || (OVar3 == Ld_A)) {
              pVVar21 = UpdateValueForCopyTypeInstr(this,globOpt,this_00,&local_38->super_Instr);
              if ((pVVar21 == (Value *)0x0) && ((local_38->super_Instr).m_opcode == LdFld)) {
                return;
              }
            }
            else {
              pSVar20 = IR::Opnd::GetStackSym((local_38->super_Instr).m_dst);
              ppVVar22 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew
                                   (this_00,&pSVar20->super_Sym);
              *ppVVar22 = (Value *)0x0;
            }
          }
        }
        if ((local_38->super_Instr).m_kind == InstrKindBranch) {
          OVar3 = (local_38->super_Instr).m_opcode;
          pBVar23 = this_01;
          if (OVar3 < ADD) {
            if ((OVar3 != MultiBr) && (OVar3 != Br)) goto LAB_0041c6a6;
LAB_0041c686:
            local_48 = (LabelInstr *)
                       (local_38->labelRefs).
                       super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator;
            if (local_48 == (LabelInstr *)0x0) {
              return;
            }
            if (((ulong)*(void **)&local_48->field_0x78 & 1) != 0) {
              return;
            }
          }
          else {
            bVar12 = LowererMD::IsUnconditionalBranch(&local_38->super_Instr);
            if (bVar12) goto LAB_0041c686;
LAB_0041c6a6:
            if (((ulong)(((local_38->labelRefs).
                          super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                         allocator)->
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                        freeList & 1) != 0) {
              return;
            }
            local_48 = CanProveConditionalBranch(this,(BranchInstr *)local_38,globOpt,this_00);
            if (local_48 == (LabelInstr *)0x0) {
              return;
            }
          }
          while (pBVar23 = (BVSparse<Memory::JitArenaAllocator> *)pBVar23->head,
                pBVar23 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            uVar34 = ((Type *)&pBVar23->alloc)->word;
            if (uVar34 != 0) {
              TVar4 = *(Type *)&pBVar23->lastFoundIndex;
              uVar32 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              do {
                BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar32);
                BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                                   (local_48->m_block->upwardExposedUses,(BVIndex)uVar32 + TVar4);
                if (BVar14 != '\0') {
                  return;
                }
                uVar34 = uVar34 & ~(1L << (uVar32 & 0x3f));
                uVar32 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
              } while (uVar34 != 0);
            }
          }
          pJVar24 = JITTimeWorkItem::GetJITFunctionBody((*ppFVar1)->m_workItem);
          uVar16 = JITTimeFunctionBody::GetSourceContextId(pJVar24);
          pFVar25 = JITTimeWorkItem::GetJITTimeInfo((*ppFVar1)->m_workItem);
          uVar17 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
          bVar12 = Js::Phases::IsEnabled
                             ((Phases *)&DAT_015b6718,PathDepBranchFoldingPhase,uVar16,uVar17);
          if (bVar12) {
            OVar3 = (local_38->super_Instr).m_opcode;
            if (OVar3 < ADD) {
              if ((OVar3 != Br) && (OVar3 != MultiBr)) goto LAB_0041c7b8;
            }
            else {
              bVar12 = LowererMD::IsUnconditionalBranch(&local_38->super_Instr);
              if (!bVar12) {
LAB_0041c7b8:
                Output::Print(L"TRACE PathDependentBranchFolding: ");
                uVar15 = this->number;
                pBVar26 = this->next;
                ppFVar31 = (Func **)&pBVar26->firstInstr;
                if (pBVar26 == (BasicBlock *)0x0) {
                  ppFVar31 = ppFVar1;
                }
                lVar33 = 0x18;
                if (pBVar26 == (BasicBlock *)0x0) {
                  lVar33 = 0xd0;
                }
                pIVar10 = *(Instr **)((long)&(*ppFVar31)->m_alloc + lVar33);
                pBVar26 = this;
                if (pIVar10->m_kind == InstrKindBranch) {
                  pBVar29 = IR::Instr::AsBranchInstr(pIVar10);
                  pBVar26 = pBVar29->m_branchTarget->m_block;
                }
                else {
                  do {
                    pBVar26 = pBVar26->next;
                  } while ((pBVar26->field_0x18 & 1) != 0);
                }
                uVar5 = pBVar26->number;
                uVar6 = local_48->m_block->number;
                pJVar24 = JITTimeWorkItem::GetJITFunctionBody((*ppFVar1)->m_workItem);
                pcVar27 = JITTimeFunctionBody::GetDisplayName(pJVar24);
                Output::Print(L"Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"
                              ,(ulong)uVar15,(ulong)uVar5,(ulong)uVar6,pcVar27);
                if (globOpt->prePassLoop != (Loop *)0x0) {
                  Output::Print(L"In LoopPrePass\n");
                }
                Output::Flush();
              }
            }
          }
          pBVar26 = this->next;
          ppFVar31 = (Func **)&pBVar26->firstInstr;
          if (pBVar26 == (BasicBlock *)0x0) {
            ppFVar31 = ppFVar1;
          }
          lVar33 = 0x18;
          if (pBVar26 == (BasicBlock *)0x0) {
            lVar33 = 0xd0;
          }
          pIVar10 = *(Instr **)((long)&(*ppFVar31)->m_alloc + lVar33);
          if ((pIVar10->m_kind != InstrKindBranch) || ((LabelInstr *)pIVar10[1].m_next != local_48))
          {
            pLVar28 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(pIVar10);
            pBVar26 = this->next;
            ppFVar31 = (Func **)&pBVar26->firstInstr;
            if (pBVar26 == (BasicBlock *)0x0) {
              ppFVar31 = ppFVar1;
            }
            lVar33 = 0x18;
            if (pBVar26 == (BasicBlock *)0x0) {
              lVar33 = 0xd0;
            }
            pIVar10 = *(Instr **)((long)&(*ppFVar31)->m_alloc + lVar33);
            if (local_48 == pLVar28) {
              GlobOpt::ConvertToByteCodeUses(globOpt,pIVar10);
            }
            else {
              func = pIVar10->m_func;
              offset = IR::Instr::GetByteCodeOffset(pIVar10);
              instr = IR::ByteCodeUsesInstr::New(func,offset);
              IR::Instr::InsertAfter(pIVar10,&instr->super_Instr);
              pBVar29 = IR::BranchInstr::New(Br,local_48,(local_48->super_Instr).m_func);
              if (pIVar10->m_kind == InstrKindBranch) {
                GlobOpt::ConvertToByteCodeUses(globOpt,pIVar10);
              }
              IR::Instr::InsertAfter(&instr->super_Instr,&pBVar29->super_Instr);
              FlowGraph::AddEdge(globOpt->func->m_fg,this,local_48->m_block);
              this->dataUseCount = this->dataUseCount + 1;
            }
            if (this_02 == (LabelInstr *)0x0) {
LAB_0041c9e8:
              this_02 = (LabelInstr *)0x0;
            }
            else if (this_02 != local_60) {
              pBVar26 = this->next;
              ppFVar31 = (Func **)&pBVar26->firstInstr;
              if (pBVar26 == (BasicBlock *)0x0) {
                ppFVar31 = ppFVar1;
              }
              lVar33 = 0x18;
              if (pBVar26 == (BasicBlock *)0x0) {
                lVar33 = 0xd0;
              }
              pIVar10 = *(Instr **)((long)&(*ppFVar31)->m_alloc + lVar33);
              instr_00 = IR::Instr::Copy(&this_02->super_Instr,true);
              IR::Instr::InsertBefore(pIVar10,instr_00);
              GlobOpt::ProcessInlineeEnd(globOpt,&this_02->super_Instr);
              goto LAB_0041c9e8;
            }
            local_a8 = (undefined1  [8])iter.last;
            iter.super_Iterator.list =
                 (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)iter.last;
            iter.super_Iterator.current = (NodeBase *)0x0;
            while( true ) {
              bVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
                       Next((EditingIterator *)local_a8);
              if (!bVar12) break;
              ppFVar30 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                   ((Iterator *)local_a8);
              pBVar26 = (*ppFVar30)->succBlock;
              if (pBVar26 == (BasicBlock *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar18 = 1;
                bVar12 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                    ,0x12fc,"(blockSucc)","blockSucc");
                if (!bVar12) goto LAB_0041cbdc;
                *puVar18 = 0;
              }
              pLVar28 = (LabelInstr *)pBVar26->firstInstr;
              IVar2 = (pLVar28->super_Instr).m_kind;
              if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar18 = 1;
                bVar12 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                    ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                if (!bVar12) goto LAB_0041cbdc;
                *puVar18 = 0;
              }
              if (local_48 != pLVar28) {
                RemoveSucc(this,pBVar26,globOpt->func->m_fg,true,true);
                if (this->dataUseCount != 0) {
                  DecrementDataUseCount(this);
                }
                if ((pBVar26->predList).
                    super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
                    count == 0) {
                  FlowGraph::RemoveBlock((*ppFVar1)->m_fg,pBVar26,globOpt,false);
                }
              }
            }
            pJVar24 = JITTimeWorkItem::GetJITFunctionBody
                                (((local_48->super_Instr).m_func)->m_workItem);
            uVar16 = JITTimeFunctionBody::GetSourceContextId(pJVar24);
            pFVar25 = JITTimeWorkItem::GetJITTimeInfo(((local_48->super_Instr).m_func)->m_workItem);
            uVar17 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
            bVar12 = Js::Phases::IsEnabled
                               ((Phases *)&DAT_015b6718,PathDepBranchFoldingPhase,uVar16,uVar17);
            if ((bVar12) && (DAT_015bc46a == '\x01')) {
              Output::Print(L"After PathDependentBranchFolding: ");
              Func::Dump(*ppFVar1);
            }
          }
        }
        else {
          local_48 = (LabelInstr *)(local_38->super_Instr).m_next;
        }
        local_38 = local_48;
      } while (local_48 != (LabelInstr *)0x0);
    }
  }
  return;
}

Assistant:

void
BasicBlock::CheckLegalityAndFoldPathDepBranches(GlobOpt* globOpt)
{
    IR::LabelInstr * lastBranchTarget = nullptr;
    IR::Instr *currentInlineeEnd = nullptr, *unskippedInlineeEnd = nullptr;
    GlobHashTable * localSymToValueMap = nullptr;
    BVSparse<JitArenaAllocator> * currentPathDefines = nullptr;

    FOREACH_INSTR_IN_BLOCK(instr, this)
    {
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode))
        {
            return;
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            unskippedInlineeEnd = currentInlineeEnd = instr;
        }
    } NEXT_INSTR_IN_BLOCK;

    IR::Instr * instr = this->GetLastInstr();

    // We have to first check the legality and only then allocate expensive data structures on the tempArena, because most block will have instructions we cant skip
    if (!IsLegalForPathDepBranches(instr))
    {
        return;
    }

    // Allocate hefty structures, we will not free them because OptBlock does a Reset on the tempAlloc
    localSymToValueMap = GlobHashTable::New(globOpt->tempAlloc, 8);
    currentPathDefines = JitAnew(globOpt->tempAlloc, BVSparse<JitArenaAllocator>, globOpt->tempAlloc);

    /* We start from the current instruction and go on scanning for legality, as long as it is legal to skip an instruction, skip.
     * When we see an unconditional branch, start scanning from the branchTarget
     * When we see a conditional branch, check if we can prove the branch target, if we can, adjust the flowgraph, and continue in the direction of the proven target
     * We stop, when we no longer can skip instructions, either due to legality check or a non provable conditional branch
    */
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return;
        }
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode)) // BailOnNoProfile etc
        {
            return;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return;
            }
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            if (currentInlineeEnd != nullptr)
            {
                return;
            }
            currentInlineeEnd = instr;
        }
        else if (instr->GetDst())
        {
            if (!instr->GetDst()->IsRegOpnd()) // complex dstOpnd, stop.
            {
                return;
            }

            IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
            currentPathDefines->Set(dst->GetStackSym()->m_id);

            if (IsCopyTypeInstr(instr))
            {
                Value *dstValue = UpdateValueForCopyTypeInstr(globOpt, localSymToValueMap, instr);
                if (instr->m_opcode == Js::OpCode::LdFld && !dstValue)
                {
                    // We cannot skip a LdFld if we didnt find its valueInfo in the localValueTable
                    return;
                }
            }
            else
            {
                Value ** localDstValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetStackSym());
                *localDstValue = nullptr;
            }
        }

        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            IR::LabelInstr* branchTarget = nullptr;

            if (branch->IsUnconditional())
            {
                branchTarget = branch->GetTarget();
                if (!branchTarget)
                {
                    return;
                }
                if (branchTarget->m_isLoopTop)
                {
                    return;
                }
            }
            else
            {
                if (branch->GetTarget()->m_isLoopTop)
                {
                    return;
                }
                branchTarget = CanProveConditionalBranch(branch, globOpt, localSymToValueMap);
                if (!branchTarget)
                {
                    return;
                }
            }

            FOREACH_BITSET_IN_SPARSEBV(id, currentPathDefines)
            {
                if (branchTarget->GetBasicBlock()->upwardExposedUses->Test(id))
                {
                    // it is used in the direction of the branch, we can't skip it
                    return;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, this->func))
            {
                if (!branch->IsUnconditional())
                {
                    Output::Print(_u("TRACE PathDependentBranchFolding: "));
                    Output::Print(_u("Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"),
                        this->GetBlockNum(),
                        this->GetLastInstr()->IsBranchInstr() ? this->GetLastInstr()->AsBranchInstr()->GetTarget()->GetBasicBlock()->GetBlockNum() : this->GetNext()->GetBlockNum(),
                        branchTarget->GetBasicBlock()->GetBlockNum(),
                        this->func->GetJITFunctionBody()->GetDisplayName());
                    if (globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("In LoopPrePass\n"));
                    }
                    Output::Flush();
                }
            }

            if (this->GetLastInstr()->IsBranchInstr() && (this->GetLastInstr()->AsBranchInstr()->GetTarget() == branchTarget))
            {
                // happens on the first block we start from only
                lastBranchTarget = branchTarget;
                instr = lastBranchTarget;
                continue;
            }
            if (branchTarget != this->GetLastInstr()->GetNextRealInstrOrLabel())
            {
                IR::Instr* lastInstr = this->GetLastInstr();
                // We add an empty ByteCodeUses with correct bytecodeoffset, for correct info on a post-op bailout of the previous instr
                IR::Instr* emptyByteCodeUse = IR::ByteCodeUsesInstr::New(lastInstr->m_func, lastInstr->GetByteCodeOffset());
                lastInstr->InsertAfter(emptyByteCodeUse);
                IR::BranchInstr * newBranch = IR::BranchInstr::New(Js::OpCode::Br, branchTarget, branchTarget->m_func);
                if (lastInstr->IsBranchInstr())
                {
                    globOpt->ConvertToByteCodeUses(lastInstr);
                }
                emptyByteCodeUse->InsertAfter(newBranch);
                globOpt->func->m_fg->AddEdge(this, branchTarget->GetBasicBlock());
                this->IncrementDataUseCount();
            }
            else
            {
                // If the new target is a fall through label, delete the branch
                globOpt->ConvertToByteCodeUses(this->GetLastInstr());
            }
            if (currentInlineeEnd != nullptr && currentInlineeEnd != unskippedInlineeEnd)
            {
                this->GetLastInstr()->InsertBefore(currentInlineeEnd->Copy());
                globOpt->ProcessInlineeEnd(currentInlineeEnd);
                currentInlineeEnd = nullptr;
            }
            // We are adding an unconditional branch, go over all the current successors and remove the ones that are dead now
            FOREACH_SUCCESSOR_BLOCK_EDITING(blockSucc, this, iter)
            {
                if (branchTarget != blockSucc->GetFirstInstr()->AsLabelInstr())
                {
                    // Change the old succ edge to dead
                    this->RemoveDeadSucc(blockSucc, globOpt->func->m_fg);
                    if (this->GetDataUseCount() > 0)
                    {
                        this->DecrementDataUseCount();
                    }
                    if (blockSucc->GetPredList()->Count() == 0)
                    {
                        this->func->m_fg->RemoveBlock(blockSucc, globOpt);
                    }
                }
            }NEXT_SUCCESSOR_BLOCK_EDITING;
            lastBranchTarget = branchTarget;
            instr = lastBranchTarget;
#if DBG
            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, instr->m_func) && Js::Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("After PathDependentBranchFolding: "));
                this->func->Dump();
            }
#endif
        }
        else
        {
            instr = instr->m_next;
        }
    }

    return;
}